

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

OutputDirective *
kj::_::
CopyConstructArray_<capnp::compiler::CompilerMain::OutputDirective,_capnp::compiler::CompilerMain::OutputDirective_*,_true,_false>
::apply(OutputDirective *pos,OutputDirective *start,OutputDirective *end)

{
  size_t sVar1;
  OutputDirective *pOVar2;
  ExceptionGuard local_28;
  
  local_28.start = pos;
  local_28.pos = pos;
  if (start != end) {
    do {
      sVar1 = (start->name).size_;
      ((local_28.pos)->name).ptr = (start->name).ptr;
      ((local_28.pos)->name).size_ = sVar1;
      Maybe<kj::Path>::Maybe(&(local_28.pos)->dir,&start->dir);
      local_28.pos = local_28.pos + 1;
      start = start + 1;
    } while (start != end);
  }
  pOVar2 = local_28.pos;
  local_28.start = local_28.pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return pOVar2;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }